

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O0

SPxId __thiscall
soplex::
SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterDenseDim
          (SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *tol)

{
  type_conflict5 tVar1;
  cpp_dec_float<200U,_int,_void> *in_RDX;
  undefined8 in_RSI;
  cpp_dec_float<200U,_int,_void> *in_RDI;
  int end;
  int i;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *coWeights_ptr;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *coTest;
  SPxId enterId;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  undefined1 local_3d0 [4];
  int in_stack_fffffffffffffc34;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffc38;
  undefined1 local_350 [128];
  undefined1 local_2d0 [8];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffd38;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffd40;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffd48;
  undefined1 local_250 [128];
  undefined1 local_1d0 [128];
  int local_150;
  int local_14c;
  undefined1 local_148 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c0;
  undefined8 local_b0;
  DataKey local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_80;
  undefined1 *local_78;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_40;
  undefined1 *local_38;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_29;
  cpp_dec_float<200U,_int,_void> *local_28;
  undefined1 *local_20;
  cpp_dec_float<200U,_int,_void> *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_b0 = in_RSI;
  SPxId::SPxId((SPxId *)0x77526d);
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::coTest(*(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             **)((in_RDI->data)._M_elems + 4));
  local_c0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::get_const_ptr((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)0x775283);
  local_c8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::get_const_ptr((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)0x7752a3);
  local_98 = local_148;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(in_RDI);
  local_14c = 0;
  local_150 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x7752e1);
  for (; local_14c < local_150; local_14c = local_14c + 1) {
    local_40 = local_c0 + local_14c;
    local_38 = local_148;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(in_RDI,in_RDX);
    local_20 = local_1d0;
    local_28 = in_RDX;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_29,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)in_RDX);
    local_10 = local_1d0;
    local_18 = local_28;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(in_RDI,in_RDX);
    local_8 = local_1d0;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate(in_RDI);
    tVar1 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_RDX,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x7753d8);
    if (tVar1) {
      local_88 = local_2d0;
      local_90 = local_148;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(in_RDI,in_RDX);
      local_80 = local_c8 + local_14c;
      local_78 = local_350;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(in_RDI,in_RDX);
      local_68 = local_3d0;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(in_RDI,in_RDX);
      steeppr::
      computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
      local_58 = local_148;
      local_60 = local_250;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(in_RDI,in_RDX);
      tVar1 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_RDX,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x7754f4);
      if (tVar1) {
        local_48 = local_b0;
        local_50 = local_148;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(in_RDI,in_RDX);
        local_a0 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::coId(in_stack_fffffffffffffc38,in_stack_fffffffffffffc34);
      }
    }
  }
  return (SPxId)local_a0;
}

Assistant:

SPxId SPxSteepPR<R>::selectEnterDenseDim(R& best, R tol)
{
   SPxId enterId;
   const R* coTest        = this->thesolver->coTest().get_const_ptr();
   const R* coWeights_ptr = this->thesolver->coWeights.get_const_ptr();

   R x;

   for(int i = 0, end = this->thesolver->dim(); i < end; ++i)
   {
      x = coTest[i];

      if(x < -tol)
      {
         x = steeppr::computePrice(x, coWeights_ptr[i], tol);

         if(x > best)
         {
            best = x;
            enterId = this->thesolver->coId(i);
         }
      }
   }

   return enterId;
}